

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O0

adios2_error adios2_variable_type_string(char *type,size_t *size,adios2_variable *variable)

{
  adios2_error aVar1;
  VariableBase *variableBase;
  char *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  string local_a8 [47];
  allocator local_79;
  string local_78 [48];
  string *in_stack_ffffffffffffffb8;
  adios2_variable *in_stack_ffffffffffffffc0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffc0,
             "for const adios2_variable, in call to adios2_variable_type_string",
             (allocator *)&stack0xffffffffffffffbf);
  adios2::helper::CheckForNullptr<adios2_variable_const>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_78,"for size_t* length, in call to adios2_variable_type_string",&local_79);
  adios2::helper::CheckForNullptr<unsigned_long>
            ((unsigned_long *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  adios2::ToString_abi_cxx11_((DataType)local_a8);
  aVar1 = anon_unknown.dwarf_2ebd5::String2CAPI
                    (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(size_t *)0x16a200);
  std::__cxx11::string::~string(local_a8);
  return aVar1;
}

Assistant:

adios2_error adios2_variable_type_string(char *type, size_t *size, const adios2_variable *variable)
{
    try
    {
        adios2::helper::CheckForNullptr(variable, "for const adios2_variable, in call to "
                                                  "adios2_variable_type_string");
        adios2::helper::CheckForNullptr(
            size, "for size_t* length, in call to adios2_variable_type_string");

        const adios2::core::VariableBase *variableBase =
            reinterpret_cast<const adios2::core::VariableBase *>(variable);
        return String2CAPI(ToString(variableBase->m_Type), type, size);
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_variable_type_string"));
    }
}